

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall
miniros::Publication::removeCallbacks(Publication *this,SubscriberCallbacksPtr *callbacks)

{
  bool bVar1;
  __shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  element_type *peVar3;
  const_iterator in_RDI;
  SubscriberCallbacksPtr *cb;
  iterator it;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
  *in_stack_ffffffffffffff70;
  shared_ptr<miniros::SubscriberCallbacks> *in_stack_ffffffffffffff78;
  __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
  local_20 [4];
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::begin((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
           *)in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::end((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
         *)in_stack_ffffffffffffff68);
  local_20[0] = std::
                find<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>*,std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>>>>,std::shared_ptr<miniros::SubscriberCallbacks>>
                          ((__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
                            )in_RDI._M_current,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::end((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
         *)in_stack_ffffffffffffff68);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff70,
                     (__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
                      *)in_stack_ffffffffffffff68);
  if (bVar1) {
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
               ::operator*(local_20)->
               super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::
             __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x488a71);
    if (peVar2->callback_queue_ != (CallbackQueueInterface *)0x0) {
      peVar2 = std::
               __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x488a82);
      in_stack_ffffffffffffff80._M_current =
           (shared_ptr<miniros::SubscriberCallbacks> *)peVar2->callback_queue_;
      peVar3 = std::__shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>::get
                         (this_00);
      (*(((element_type *)
         (((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
            *)in_stack_ffffffffffffff80._M_current)->
         super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->connect_)._M_invoker)
                (in_stack_ffffffffffffff80._M_current,peVar3);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>const*,std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>>>>
    ::__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>*>
              ((__normal_iterator<const_std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
                *)&in_RDI._M_current[0xb].
                   super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,
               (__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
                *)in_stack_ffffffffffffff68);
    std::
    vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
    ::erase((vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
             *)in_stack_ffffffffffffff80._M_current,in_RDI);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x488b13);
  return;
}

Assistant:

void Publication::removeCallbacks(const SubscriberCallbacksPtr& callbacks)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  V_Callback::iterator it = std::find(callbacks_.begin(), callbacks_.end(), callbacks);
  if (it != callbacks_.end())
  {
    const SubscriberCallbacksPtr& cb = *it;
    if (cb->callback_queue_)
    {
      cb->callback_queue_->removeByID((uint64_t)cb.get());
    }
    callbacks_.erase(it);
  }
}